

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O3

int gost_grasshopper_cipher_do_ctr(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  uint8_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  grasshopper_w128_t *source;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  bool bVar13;
  
  lVar8 = EVP_CIPHER_CTX_get_cipher_data();
  source = (grasshopper_w128_t *)EVP_CIPHER_CTX_iv_noconst(ctx);
  uVar7 = EVP_CIPHER_CTX_get_num(ctx);
  sVar10 = inl;
  sVar11 = inl;
  if (inl != 0 && uVar7 != 0) {
    do {
      uVar6 = *(uint *)in;
      in = (uchar *)((long)in + 1);
      *out = *(byte *)(lVar8 + 0x198 + (ulong)uVar7) ^ (byte)uVar6;
      out = (uchar *)((long)out + 1);
      sVar11 = sVar10 - 1;
      uVar7 = uVar7 + 1 & 0xf;
      if (uVar7 == 0) break;
      bVar13 = sVar10 != 1;
      sVar10 = sVar11;
    } while (bVar13);
  }
  EVP_CIPHER_CTX_set_num(ctx,uVar7);
  if (0xf < sVar11) {
    uVar12 = 0;
    do {
      grasshopper_encrypt_block
                ((grasshopper_round_keys_t *)(lVar8 + 0x48),source,
                 (grasshopper_w128_t *)(lVar8 + 0x198),(grasshopper_w128_t *)(lVar8 + 0x188));
      uVar7 = *(uint *)(lVar8 + 0x19c);
      uVar6 = *(uint *)(lVar8 + 0x1a0);
      uVar2 = *(uint *)(lVar8 + 0x1a4);
      uVar3 = *(uint *)((long)in + 4);
      uVar4 = *(uint *)((long)in + 8);
      uVar5 = *(uint *)((long)in + 0xc);
      *(uint *)out = *(uint *)in ^ ((grasshopper_w128_t *)(lVar8 + 0x198))->d[0];
      *(uint *)((long)out + 4) = uVar3 ^ uVar7;
      *(uint *)((long)out + 8) = uVar4 ^ uVar6;
      *(uint *)((long)out + 0xc) = uVar5 ^ uVar2;
      lVar9 = 0xf;
      do {
        uVar1 = source->b[lVar9];
        source->b[lVar9] = uVar1 + '\x01';
        bVar13 = lVar9 == 0;
        lVar9 = lVar9 + -1;
        if (bVar13) break;
      } while ((uint8_t)(uVar1 + '\x01') == '\0');
      in = (uchar *)((long)in + 0x10);
      out = (uchar *)((long)out + 0x10);
      uVar12 = uVar12 + 1;
    } while (uVar12 != sVar11 >> 4);
    sVar11 = (size_t)((uint)sVar11 & 0xf);
  }
  if (sVar11 != 0) {
    grasshopper_encrypt_block
              ((grasshopper_round_keys_t *)(lVar8 + 0x48),source,
               (grasshopper_w128_t *)(lVar8 + 0x198),(grasshopper_w128_t *)(lVar8 + 0x188));
    uVar12 = 0;
    do {
      *(byte *)((long)out + uVar12) =
           *(byte *)((long)in + uVar12) ^ ((grasshopper_w128_t *)(lVar8 + 0x198))->b[uVar12];
      uVar12 = uVar12 + 1;
    } while (sVar11 != uVar12);
    EVP_CIPHER_CTX_set_num(ctx,sVar11 & 0xffffffff);
    lVar8 = 0xf;
    do {
      uVar1 = source->b[lVar8];
      source->b[lVar8] = uVar1 + '\x01';
      bVar13 = lVar8 == 0;
      lVar8 = lVar8 + -1;
      if (bVar13) break;
    } while ((uint8_t)(uVar1 + '\x01') == '\0');
  }
  return (int)inl;
}

Assistant:

static int gost_grasshopper_cipher_do_ctr(EVP_CIPHER_CTX *ctx, unsigned char *out,
                                          const unsigned char *in, size_t inl)
{
    gost_grasshopper_cipher_ctx_ctr *c = (gost_grasshopper_cipher_ctx_ctr *)
        EVP_CIPHER_CTX_get_cipher_data(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
    const unsigned char *current_in = in;
    unsigned char *current_out = out;
    grasshopper_w128_t *currentInputBlock;
    grasshopper_w128_t *currentOutputBlock;
    unsigned int n = EVP_CIPHER_CTX_num(ctx);
    size_t lasted = inl;
    size_t i;
    size_t blocks;
    grasshopper_w128_t *iv_buffer;
    grasshopper_w128_t tmp;

    while (n && lasted) {
        *(current_out++) = *(current_in++) ^ c->partial_buffer.b[n];
        --lasted;
        n = (n + 1) % GRASSHOPPER_BLOCK_SIZE;
    }
    EVP_CIPHER_CTX_set_num(ctx, n);
    blocks = lasted / GRASSHOPPER_BLOCK_SIZE;

    iv_buffer = (grasshopper_w128_t *) iv;

    // full parts
    for (i = 0; i < blocks; i++) {
        currentInputBlock = (grasshopper_w128_t *) current_in;
        currentOutputBlock = (grasshopper_w128_t *) current_out;
        grasshopper_encrypt_block(&c->c.encrypt_round_keys, iv_buffer,
                                  &c->partial_buffer, &c->c.buffer);
        grasshopper_plus128(&tmp, &c->partial_buffer, currentInputBlock);
        grasshopper_copy128(currentOutputBlock, &tmp);
        ctr128_inc(iv_buffer->b);
        current_in += GRASSHOPPER_BLOCK_SIZE;
        current_out += GRASSHOPPER_BLOCK_SIZE;
        lasted -= GRASSHOPPER_BLOCK_SIZE;
    }

    if (lasted > 0) {
        currentInputBlock = (grasshopper_w128_t *) current_in;
        currentOutputBlock = (grasshopper_w128_t *) current_out;
        grasshopper_encrypt_block(&c->c.encrypt_round_keys, iv_buffer,
                                  &c->partial_buffer, &c->c.buffer);
        for (i = 0; i < lasted; i++) {
            currentOutputBlock->b[i] =
                c->partial_buffer.b[i] ^ currentInputBlock->b[i];
        }
        EVP_CIPHER_CTX_set_num(ctx, i);
        ctr128_inc(iv_buffer->b);
    }

    return inl;
}